

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall Spaghetti<UFPC>::SecondScan(Spaghetti<UFPC> *this)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uchar *puVar4;
  uint *puVar5;
  int iLabel_3;
  int iLabel_2;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_1;
  int iLabel_1;
  int iLabel;
  int c;
  uint *img_labels_row_fol;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row;
  int r;
  Spaghetti<UFPC> *this_local;
  
  uVar3 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar3;
  for (img_row._4_4_ = 0;
      img_row._4_4_ < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
      img_row._4_4_ = img_row._4_4_ + 2) {
    puVar4 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar5 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iLabel_1 = 0; iLabel_1 < this->e_cols; iLabel_1 = iLabel_1 + 2) {
      if ((int)puVar5[iLabel_1] < 1) {
        puVar5[iLabel_1] = 0;
        puVar5[iLabel_1 + 1] = 0;
        *(undefined4 *)((long)puVar5 + (long)iLabel_1 * 4 + lVar2) = 0;
        *(undefined4 *)((long)puVar5 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
      }
      else {
        uVar3 = UFPC::GetLabel(puVar5[iLabel_1]);
        if (puVar4[iLabel_1] == '\0') {
          puVar5[iLabel_1] = 0;
        }
        else {
          puVar5[iLabel_1] = uVar3;
        }
        if (puVar4[iLabel_1 + 1] == '\0') {
          puVar5[iLabel_1 + 1] = 0;
        }
        else {
          puVar5[iLabel_1 + 1] = uVar3;
        }
        if (puVar4[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar5 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar5 + (long)iLabel_1 * 4 + lVar2) = uVar3;
        }
        if (puVar4[(iLabel_1 + 1) + lVar1] == '\0') {
          *(undefined4 *)((long)puVar5 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar5 + (long)(iLabel_1 + 1) * 4 + lVar2) = uVar3;
        }
      }
    }
    if ((this->o_cols & 1U) != 0) {
      if ((int)puVar5[iLabel_1] < 1) {
        puVar5[iLabel_1] = 0;
        *(undefined4 *)((long)puVar5 + (long)iLabel_1 * 4 + lVar2) = 0;
      }
      else {
        uVar3 = UFPC::GetLabel(puVar5[iLabel_1]);
        if (puVar4[iLabel_1] == '\0') {
          puVar5[iLabel_1] = 0;
        }
        else {
          puVar5[iLabel_1] = uVar3;
        }
        if (puVar4[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar5 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar5 + (long)iLabel_1 * 4 + lVar2) = uVar3;
        }
      }
    }
  }
  if ((this->o_rows & 1U) != 0) {
    puVar4 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        img_row._4_4_);
    puVar5 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    for (iLabel_3 = 0; iLabel_3 < this->e_cols; iLabel_3 = iLabel_3 + 2) {
      if ((int)puVar5[iLabel_3] < 1) {
        puVar5[iLabel_3] = 0;
        puVar5[iLabel_3 + 1] = 0;
      }
      else {
        uVar3 = UFPC::GetLabel(puVar5[iLabel_3]);
        if (puVar4[iLabel_3] == '\0') {
          puVar5[iLabel_3] = 0;
        }
        else {
          puVar5[iLabel_3] = uVar3;
        }
        if (puVar4[iLabel_3 + 1] == '\0') {
          puVar5[iLabel_3 + 1] = 0;
        }
        else {
          puVar5[iLabel_3 + 1] = uVar3;
        }
      }
    }
    if ((this->o_cols & 1U) != 0) {
      if ((int)puVar5[iLabel_3] < 1) {
        puVar5[iLabel_3] = 0;
      }
      else {
        uVar3 = UFPC::GetLabel(puVar5[iLabel_3]);
        if (puVar4[iLabel_3] == '\0') {
          puVar5[iLabel_3] = 0;
        }
        else {
          puVar5[iLabel_3] = uVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void SecondScan()
	{   // Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}
	}